

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O0

Pass * wasm::createMemory64LoweringPass(void)

{
  Pass *this;
  
  this = (Pass *)operator_new(0x108);
  memset(this,0,0x108);
  Memory64Lowering::Memory64Lowering((Memory64Lowering *)this);
  return this;
}

Assistant:

Pass* createMemory64LoweringPass() { return new Memory64Lowering(); }